

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UBool __thiscall icu_63::LocDataParser::inList(LocDataParser *this,UChar c,UChar *list)

{
  UBool UVar1;
  bool bVar2;
  UChar *local_28;
  UChar *list_local;
  UChar c_local;
  LocDataParser *this_local;
  
  local_28 = list;
  if ((*list == L' ') && (UVar1 = PatternProps::isWhiteSpace((uint)(ushort)c), UVar1 != '\0')) {
    this_local._7_1_ = true;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (*local_28 != L'\0') {
        bVar2 = *local_28 != c;
      }
      if (!bVar2) break;
      local_28 = local_28 + 1;
    }
    this_local._7_1_ = *local_28 == c;
  }
  return this_local._7_1_;
}

Assistant:

inline UBool inList(UChar c, const UChar* list) const {
        if (*list == SPACE && PatternProps::isWhiteSpace(c)) {
            return TRUE;
        }
        while (*list && *list != c) {
            ++list;
        }
        return *list == c;
    }